

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

int __thiscall QRegularExpression::captureCount(QRegularExpression *this)

{
  QRegularExpressionPrivate *pQVar1;
  int iVar2;
  
  QRegularExpressionPrivate::compilePattern((this->d).d.ptr);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->compiledPattern == (pcre2_code_16 *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = pQVar1->capturingCount;
  }
  return iVar2;
}

Assistant:

int QRegularExpression::captureCount() const
{
    if (!isValid()) // will compile the pattern
        return -1;
    return d->capturingCount;
}